

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<char,unsigned_long_long>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2d;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2c;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2b;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2a;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_29;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_28;
  int local_20 [6];
  
  local_20[5] = 3;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(&local_29,local_20 + 5);
  if (local_29.m_int != '\x02') {
    local_20[4] = 4;
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>(&local_2a,local_20 + 4);
    if (local_2a.m_int != '\x05') {
      local_20[3] = 6;
      SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>(&local_2b,local_20 + 3);
      local_20[2] = 7;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>(&local_28,local_20 + 2);
      if (((long)local_2b.m_int < 0) || (local_28.m_int != (long)local_2b.m_int)) {
        local_20[1] = 1;
        SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
        SafeInt<int>(&local_2c,local_20 + 1);
        if (local_2c.m_int == '\0') {
          local_20[0] = 0;
          SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          SafeInt<int>(&local_2d,local_20);
          return local_2d.m_int != '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}